

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O0

double __thiscall
DetectorExample_LUX_RUN03::FitS1
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm,LCE map)

{
  uint uVar1;
  ostream *this_00;
  int __x;
  DetectorExample_LUX_RUN03 *pDVar2;
  double dVar3;
  double dVar4;
  double __x_00;
  double dVar5;
  double dVar6;
  double finalCorr;
  double shape;
  double amplitude;
  double radius;
  LCE map_local;
  double zPos_mm_local;
  double yPos_mm_local;
  double xPos_mm_local;
  DetectorExample_LUX_RUN03 *this_local;
  
  pDVar2 = this;
  dVar3 = pow(xPos_mm,2.0);
  __x = (int)pDVar2;
  dVar4 = pow(yPos_mm,2.0);
  dVar3 = sqrt(dVar3 + dVar4);
  dVar4 = pow(zPos_mm,2.0);
  std::abs(__x);
  dVar5 = sqrt(__x_00);
  dVar6 = pow(dVar3,3.0);
  this_local = (DetectorExample_LUX_RUN03 *)
               ((-(dVar5 * 1.1525e-07) * dVar6 + dVar4 * 0.0002257 + zPos_mm * -0.3071 + 307.9) /
               307.9);
  if (((((double)this_local < 0.5) || (1.5 < (double)this_local)) ||
      (uVar1 = std::isnan((double)this_local), (uVar1 & 1) != 0)) &&
     (dVar3 < (this->super_VDetector).radmax)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "ERR: S1 corrections exceed a 50% difference. Are you sure you didn\'t forget to change LUX numbers for your own detector??"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (DetectorExample_LUX_RUN03 *)0x3ff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double FitS1(double xPos_mm, double yPos_mm, double zPos_mm,
               LCE map) override {
    double radius = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
    double amplitude = 307.9 - 0.3071 * zPos_mm + 0.0002257 * pow(zPos_mm, 2.);
    double shape = 1.1525e-7 * sqrt(std::abs(zPos_mm - 318.84));
    double finalCorr = -shape * pow(radius, 3.) + amplitude;
    finalCorr /= 307.9;
    if ((finalCorr < 0.5 || finalCorr > 1.5 || std::isnan(finalCorr)) &&
        radius < radmax) {
      cerr << "ERR: S1 corrections exceed a 50% difference. Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return 1.;
    } else
      return finalCorr;
  }